

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall
ncnn::Reshape::forward
          (Reshape *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  const_reference pvVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar5;
  int dims;
  int total;
  int outc;
  int outd;
  int outh;
  int outw;
  Mat *top_blob;
  Mat *bottom_blob;
  int *in_stack_fffffffffffffb10;
  undefined8 *puVar6;
  int *in_stack_fffffffffffffb18;
  const_reference pvVar7;
  int *in_stack_fffffffffffffb20;
  const_reference pvVar8;
  int *in_stack_fffffffffffffb28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffb30;
  value_type *pvVar9;
  Reshape *in_stack_fffffffffffffb38;
  Allocator *in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  const_reference pvVar10;
  Mat *in_stack_fffffffffffffb78;
  void *local_450;
  int *local_448;
  size_t local_440;
  int local_438;
  Allocator *local_430;
  int local_428;
  int local_424;
  Allocator *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  size_t sVar11;
  Mat *in_stack_fffffffffffffbf8;
  int *local_400;
  size_t local_3f8;
  int local_3f0;
  Allocator *local_3e8;
  int local_3e0;
  int local_3dc;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  size_t local_3c8;
  value_type local_3c0;
  value_type local_368;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  const_reference local_308;
  const_reference local_300;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2f0;
  int local_2d4;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  
  sVar11 = CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0);
  local_2f0 = in_RDX;
  local_300 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_308 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_2f0,0);
  local_30c = *(int *)(in_RDI + 0xd0);
  local_310 = *(int *)(in_RDI + 0xd4);
  local_314 = *(int *)(in_RDI + 0xd8);
  local_318 = *(int *)(in_RDI + 0xdc);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    eval_shape_expr(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                    in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  }
  pvVar8 = local_300;
  pvVar7 = local_308;
  local_31c = local_300->w * local_300->h * local_300->d * local_300->c;
  local_320 = local_300->dims;
  if (*(int *)(in_RDI + 0xe0) == 1) {
    if (local_30c == 0) {
      local_30c = local_300->w;
    }
    if (local_30c == -1) {
      local_30c = local_31c;
    }
    if ((local_320 == 1) && (local_300->w == local_30c)) {
      if (local_308 != local_300) {
        if (local_300->refcount != (int *)0x0) {
          LOCK();
          *local_300->refcount = *local_300->refcount + 1;
          UNLOCK();
        }
        if (local_308->refcount != (int *)0x0) {
          piVar2 = local_308->refcount;
          LOCK();
          iVar1 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_308->allocator == (Allocator *)0x0) {
              if (local_308->data != (void *)0x0) {
                free(local_308->data);
              }
            }
            else {
              (*local_308->allocator->_vptr_Allocator[3])(local_308->allocator,local_308->data);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar7->data = pvVar8->data;
        pvVar7->refcount = pvVar8->refcount;
        pvVar7->elemsize = pvVar8->elemsize;
        pvVar7->elempack = pvVar8->elempack;
        pvVar7->allocator = pvVar8->allocator;
        pvVar7->dims = pvVar8->dims;
        pvVar7->w = pvVar8->w;
        pvVar7->h = pvVar8->h;
        pvVar7->d = pvVar8->d;
        pvVar7->c = pvVar8->c;
        pvVar7->cstep = pvVar8->cstep;
      }
      return 0;
    }
  }
  pvVar4 = local_300;
  if (*(int *)(in_RDI + 0xe0) == 2) {
    if (local_30c == 0) {
      local_30c = local_300->w;
    }
    if (local_310 == 0) {
      local_310 = local_300->h;
    }
    if (local_30c == -1) {
      local_30c = local_31c / local_310;
      pvVar4 = (const_reference)((long)local_31c % (long)local_310 & 0xffffffff);
    }
    if (local_310 == -1) {
      local_310 = local_31c / local_30c;
      pvVar4 = (const_reference)((long)local_31c % (long)local_30c & 0xffffffff);
    }
    if ((local_320 == 2) && (local_300->h == local_310)) {
      if (local_308 != local_300) {
        if (local_300->refcount != (int *)0x0) {
          LOCK();
          *local_300->refcount = *local_300->refcount + 1;
          UNLOCK();
        }
        if (local_308->refcount != (int *)0x0) {
          piVar2 = local_308->refcount;
          LOCK();
          iVar1 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_308->allocator == (Allocator *)0x0) {
              if (local_308->data != (void *)0x0) {
                free(local_308->data);
              }
            }
            else {
              (*local_308->allocator->_vptr_Allocator[3])(local_308->allocator,local_308->data);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar7->data = pvVar8->data;
        pvVar7->refcount = pvVar8->refcount;
        pvVar7->elemsize = pvVar8->elemsize;
        pvVar7->elempack = pvVar8->elempack;
        pvVar7->allocator = pvVar8->allocator;
        pvVar7->dims = pvVar8->dims;
        pvVar7->w = pvVar8->w;
        pvVar7->h = pvVar8->h;
        pvVar7->d = pvVar8->d;
        pvVar7->c = pvVar8->c;
        pvVar7->cstep = pvVar8->cstep;
      }
      return 0;
    }
  }
  if (*(int *)(in_RDI + 0xe0) == 3) {
    if (local_30c == 0) {
      local_30c = local_300->w;
    }
    if (local_310 == 0) {
      local_310 = local_300->h;
    }
    if (local_318 == 0) {
      local_318 = local_300->c;
    }
    if (local_30c == -1) {
      uVar3 = (ulong)(uint)((int)((long)local_31c / (long)local_318) >> 0x1f) << 0x20 |
              (long)local_31c / (long)local_318 & 0xffffffffU;
      pvVar4 = (const_reference)((long)uVar3 % (long)local_310 & 0xffffffff);
      local_30c = (int)((long)uVar3 / (long)local_310);
    }
    if (local_310 == -1) {
      uVar3 = (ulong)(uint)((int)((long)local_31c / (long)local_318) >> 0x1f) << 0x20 |
              (long)local_31c / (long)local_318 & 0xffffffffU;
      pvVar4 = (const_reference)((long)uVar3 % (long)local_30c & 0xffffffff);
      local_310 = (int)((long)uVar3 / (long)local_30c);
    }
    if (local_318 == -1) {
      uVar3 = (ulong)(uint)((int)((long)local_31c / (long)local_310) >> 0x1f) << 0x20 |
              (long)local_31c / (long)local_310 & 0xffffffffU;
      pvVar4 = (const_reference)((long)uVar3 % (long)local_30c & 0xffffffff);
      local_318 = (int)((long)uVar3 / (long)local_30c);
    }
    if ((local_320 == 3) && (local_300->c == local_318)) {
      if (local_308 != local_300) {
        if (local_300->refcount != (int *)0x0) {
          LOCK();
          *local_300->refcount = *local_300->refcount + 1;
          UNLOCK();
        }
        pvVar4 = local_308;
        if (local_308->refcount != (int *)0x0) {
          piVar2 = local_308->refcount;
          LOCK();
          iVar1 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_308->allocator == (Allocator *)0x0) {
              if (local_308->data != (void *)0x0) {
                free(local_308->data);
              }
            }
            else {
              (*local_308->allocator->_vptr_Allocator[3])(local_308->allocator,local_308->data);
            }
          }
        }
        pvVar4->data = (void *)0x0;
        pvVar4->elemsize = 0;
        pvVar4->elempack = 0;
        pvVar4->dims = 0;
        pvVar4->w = 0;
        pvVar4->h = 0;
        pvVar4->d = 0;
        pvVar4->c = 0;
        pvVar4->cstep = 0;
        pvVar4->refcount = (int *)0x0;
        pvVar7->data = pvVar8->data;
        pvVar7->refcount = pvVar8->refcount;
        pvVar7->elemsize = pvVar8->elemsize;
        pvVar7->elempack = pvVar8->elempack;
        pvVar7->allocator = pvVar8->allocator;
        pvVar7->dims = pvVar8->dims;
        pvVar7->w = pvVar8->w;
        pvVar7->h = pvVar8->h;
        pvVar7->d = pvVar8->d;
        pvVar7->c = pvVar8->c;
        pvVar7->cstep = pvVar8->cstep;
      }
      local_308->w = local_30c;
      local_308->h = local_310;
      return 0;
    }
  }
  if (*(int *)(in_RDI + 0xe0) == 4) {
    if (local_30c == 0) {
      local_30c = local_300->w;
    }
    if (local_310 == 0) {
      local_310 = local_300->h;
    }
    if (local_318 == 0) {
      local_318 = local_300->c;
    }
    if (local_314 == 0) {
      local_314 = local_300->d;
    }
    if (local_30c == -1) {
      uVar3 = (long)((ulong)(uint)((int)((long)local_31c / (long)local_318) >> 0x1f) << 0x20 |
                    (long)local_31c / (long)local_318 & 0xffffffffU) / (long)local_314;
      uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      pvVar4 = (const_reference)((long)uVar3 % (long)local_310 & 0xffffffff);
      local_30c = (int)((long)uVar3 / (long)local_310);
    }
    if (local_310 == -1) {
      uVar3 = (long)((ulong)(uint)((int)((long)local_31c / (long)local_318) >> 0x1f) << 0x20 |
                    (long)local_31c / (long)local_318 & 0xffffffffU) / (long)local_314;
      uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      pvVar4 = (const_reference)((long)uVar3 % (long)local_30c & 0xffffffff);
      local_310 = (int)((long)uVar3 / (long)local_30c);
    }
    if (local_314 == -1) {
      uVar3 = (long)((ulong)(uint)((int)((long)local_31c / (long)local_318) >> 0x1f) << 0x20 |
                    (long)local_31c / (long)local_318 & 0xffffffffU) / (long)local_310;
      uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      pvVar4 = (const_reference)((long)uVar3 % (long)local_30c & 0xffffffff);
      local_314 = (int)((long)uVar3 / (long)local_30c);
    }
    if (local_318 == -1) {
      uVar3 = (long)((ulong)(uint)((int)((long)local_31c / (long)local_314) >> 0x1f) << 0x20 |
                    (long)local_31c / (long)local_314 & 0xffffffffU) / (long)local_310;
      uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
      pvVar4 = (const_reference)((long)uVar3 % (long)local_30c & 0xffffffff);
      local_318 = (int)((long)uVar3 / (long)local_30c);
    }
    if ((local_320 == 4) && (local_300->c == local_318)) {
      if (local_308 != local_300) {
        if (local_300->refcount != (int *)0x0) {
          LOCK();
          *local_300->refcount = *local_300->refcount + 1;
          UNLOCK();
        }
        pvVar10 = local_308;
        if (local_308->refcount != (int *)0x0) {
          piVar2 = local_308->refcount;
          LOCK();
          iVar1 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar1 == 1) {
            if (local_308->allocator == (Allocator *)0x0) {
              if (local_308->data != (void *)0x0) {
                free(local_308->data);
              }
            }
            else {
              (*local_308->allocator->_vptr_Allocator[3])
                        (local_308->allocator,local_308->data,pvVar4);
            }
          }
        }
        pvVar7->data = (void *)0x0;
        pvVar7->elemsize = 0;
        pvVar7->elempack = 0;
        pvVar7->dims = 0;
        pvVar7->w = 0;
        pvVar7->h = 0;
        pvVar7->d = 0;
        pvVar7->c = 0;
        pvVar7->cstep = 0;
        pvVar7->refcount = (int *)0x0;
        pvVar10->data = pvVar8->data;
        pvVar10->refcount = pvVar8->refcount;
        pvVar10->elemsize = pvVar8->elemsize;
        pvVar10->elempack = pvVar8->elempack;
        pvVar10->allocator = pvVar8->allocator;
        pvVar10->dims = pvVar8->dims;
        pvVar10->w = pvVar8->w;
        pvVar10->h = pvVar8->h;
        pvVar10->d = pvVar8->d;
        pvVar10->c = pvVar8->c;
        pvVar10->cstep = pvVar8->cstep;
      }
      local_308->w = local_30c;
      local_308->h = local_310;
      local_308->d = local_314;
      return 0;
    }
  }
  if (*(int *)(in_RDI + 0xe0) == 1) {
    Mat::reshape(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                 in_stack_fffffffffffffb68);
    pvVar7 = local_308;
    if (local_308 != &local_368) {
      if (local_368.refcount != (int *)0x0) {
        LOCK();
        *local_368.refcount = *local_368.refcount + 1;
        UNLOCK();
      }
      if (local_308->refcount != (int *)0x0) {
        piVar2 = local_308->refcount;
        LOCK();
        iVar1 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_308->allocator == (Allocator *)0x0) {
            if (local_308->data != (void *)0x0) {
              free(local_308->data);
            }
          }
          else {
            (*local_308->allocator->_vptr_Allocator[3])(local_308->allocator,local_308->data);
          }
        }
      }
      pvVar7->data = (void *)0x0;
      pvVar7->elemsize = 0;
      pvVar7->elempack = 0;
      pvVar7->dims = 0;
      pvVar7->w = 0;
      pvVar7->h = 0;
      pvVar7->d = 0;
      pvVar7->c = 0;
      pvVar7->cstep = 0;
      pvVar7->refcount = (int *)0x0;
      pvVar7->data = local_368.data;
      pvVar7->refcount = local_368.refcount;
      pvVar7->elemsize = local_368.elemsize;
      pvVar7->elempack = local_368.elempack;
      pvVar7->allocator = local_368.allocator;
      pvVar7->dims = local_368.dims;
      pvVar7->w = local_368.w;
      pvVar7->h = local_368.h;
      pvVar7->d = local_368.d;
      pvVar7->c = local_368.c;
      pvVar7->cstep = local_368.cstep;
    }
    if (local_368.refcount != (int *)0x0) {
      LOCK();
      iVar1 = *local_368.refcount;
      *local_368.refcount = *local_368.refcount + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_368.allocator == (Allocator *)0x0) {
          if (local_368.data != (void *)0x0) {
            free(local_368.data);
          }
        }
        else {
          (*(local_368.allocator)->_vptr_Allocator[3])(local_368.allocator,local_368.data);
        }
      }
    }
    local_368.data = (void *)0x0;
    local_368.elemsize = 0;
    local_368.elempack = 0;
    local_368.dims = 0;
    local_368.w = 0;
    local_368.h = 0;
    local_368.d = 0;
    local_368.c = 0;
    local_368.cstep = 0;
    local_368.refcount = (int *)0x0;
  }
  if (*(int *)(in_RDI + 0xe0) == 2) {
    Mat::reshape(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
                 (int)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    pvVar7 = local_308;
    if (local_308 != &local_3c0) {
      if (local_3c0.refcount != (int *)0x0) {
        LOCK();
        *local_3c0.refcount = *local_3c0.refcount + 1;
        UNLOCK();
      }
      pvVar8 = local_308;
      if (local_308->refcount != (int *)0x0) {
        piVar2 = local_308->refcount;
        LOCK();
        iVar1 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_308->allocator == (Allocator *)0x0) {
            if (local_308->data != (void *)0x0) {
              free(local_308->data);
            }
          }
          else {
            (*local_308->allocator->_vptr_Allocator[3])(local_308->allocator,local_308->data);
          }
        }
      }
      pvVar8->data = (void *)0x0;
      pvVar8->elemsize = 0;
      pvVar8->elempack = 0;
      pvVar8->dims = 0;
      pvVar8->w = 0;
      pvVar8->h = 0;
      pvVar8->d = 0;
      pvVar8->c = 0;
      pvVar8->cstep = 0;
      pvVar8->refcount = (int *)0x0;
      pvVar7->data = local_3c0.data;
      pvVar7->refcount = local_3c0.refcount;
      pvVar7->elemsize = local_3c0.elemsize;
      pvVar7->elempack = local_3c0.elempack;
      pvVar7->allocator = local_3c0.allocator;
      pvVar7->dims = local_3c0.dims;
      pvVar7->w = local_3c0.w;
      pvVar7->h = local_3c0.h;
      pvVar7->d = local_3c0.d;
      pvVar7->c = local_3c0.c;
      pvVar7->cstep = local_3c0.cstep;
    }
    pvVar9 = &local_3c0;
    if (local_3c0.refcount != (int *)0x0) {
      LOCK();
      iVar1 = *local_3c0.refcount;
      *local_3c0.refcount = *local_3c0.refcount + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_3c0.allocator == (Allocator *)0x0) {
          if (local_3c0.data != (void *)0x0) {
            free(local_3c0.data);
          }
        }
        else {
          (*(local_3c0.allocator)->_vptr_Allocator[3])(local_3c0.allocator,local_3c0.data);
        }
      }
    }
    pvVar9->data = (void *)0x0;
    pvVar9->elemsize = 0;
    pvVar9->elempack = 0;
    pvVar9->dims = 0;
    pvVar9->w = 0;
    pvVar9->h = 0;
    pvVar9->d = 0;
    pvVar9->c = 0;
    pvVar9->cstep = 0;
    pvVar9->refcount = (int *)0x0;
  }
  if (*(int *)(in_RDI + 0xe0) == 3) {
    Mat::reshape(in_stack_fffffffffffffbf8,(int)(sVar11 >> 0x20),(int)sVar11,
                 in_stack_fffffffffffffbec,in_stack_fffffffffffffbe0);
    if (local_308 != (const_reference)&stack0xfffffffffffffbf8) {
      if (local_400 != (int *)0x0) {
        LOCK();
        *local_400 = *local_400 + 1;
        UNLOCK();
      }
      pvVar7 = local_308;
      pvVar8 = local_308;
      if (local_308->refcount != (int *)0x0) {
        piVar2 = local_308->refcount;
        LOCK();
        iVar1 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_308->allocator == (Allocator *)0x0) {
            if (local_308->data != (void *)0x0) {
              free(local_308->data);
            }
          }
          else {
            (*local_308->allocator->_vptr_Allocator[3])(local_308->allocator,local_308->data);
          }
        }
      }
      pvVar7->data = (void *)0x0;
      pvVar7->elemsize = 0;
      pvVar7->elempack = 0;
      pvVar7->dims = 0;
      pvVar7->w = 0;
      pvVar7->h = 0;
      pvVar7->d = 0;
      pvVar7->c = 0;
      pvVar7->cstep = 0;
      pvVar7->refcount = (int *)0x0;
      pvVar8->data = in_stack_fffffffffffffbf8;
      pvVar8->refcount = local_400;
      pvVar8->elemsize = local_3f8;
      pvVar8->elempack = local_3f0;
      pvVar8->allocator = local_3e8;
      pvVar8->dims = local_3e0;
      pvVar8->w = local_3dc;
      pvVar8->h = local_3d8;
      pvVar8->d = local_3d4;
      pvVar8->c = local_3d0;
      pvVar8->cstep = local_3c8;
    }
    puVar6 = (undefined8 *)&stack0xfffffffffffffbf8;
    if (local_400 != (int *)0x0) {
      LOCK();
      iVar1 = *local_400;
      *local_400 = *local_400 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_3e8 == (Allocator *)0x0) {
          if (in_stack_fffffffffffffbf8 != (Mat *)0x0) {
            free(in_stack_fffffffffffffbf8);
          }
        }
        else {
          (*local_3e8->_vptr_Allocator[3])(local_3e8,in_stack_fffffffffffffbf8);
        }
      }
    }
    *puVar6 = 0;
    puVar6[2] = 0;
    *(undefined4 *)(puVar6 + 3) = 0;
    *(undefined4 *)(puVar6 + 5) = 0;
    *(undefined4 *)((long)puVar6 + 0x2c) = 0;
    *(undefined4 *)(puVar6 + 6) = 0;
    *(undefined4 *)((long)puVar6 + 0x34) = 0;
    *(undefined4 *)(puVar6 + 7) = 0;
    puVar6[8] = 0;
    puVar6[1] = 0;
  }
  if (*(int *)(in_RDI + 0xe0) == 4) {
    Mat::reshape(in_stack_fffffffffffffbf8,(int)(sVar11 >> 0x20),(int)sVar11,
                 in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8,
                 (Allocator *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    pvVar7 = local_308;
    if (local_308 != (const_reference)&local_450) {
      if (local_448 != (int *)0x0) {
        LOCK();
        *local_448 = *local_448 + 1;
        UNLOCK();
      }
      if (local_308->refcount != (int *)0x0) {
        piVar2 = local_308->refcount;
        LOCK();
        iVar1 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_308->allocator == (Allocator *)0x0) {
            if (local_308->data != (void *)0x0) {
              free(local_308->data);
            }
          }
          else {
            (*local_308->allocator->_vptr_Allocator[3])(local_308->allocator,local_308->data);
          }
        }
      }
      pvVar7->data = (void *)0x0;
      pvVar7->elemsize = 0;
      pvVar7->elempack = 0;
      pvVar7->dims = 0;
      pvVar7->w = 0;
      pvVar7->h = 0;
      pvVar7->d = 0;
      pvVar7->c = 0;
      pvVar7->cstep = 0;
      pvVar7->refcount = (int *)0x0;
      pvVar7->data = local_450;
      pvVar7->refcount = local_448;
      pvVar7->elemsize = local_440;
      pvVar7->elempack = local_438;
      pvVar7->allocator = local_430;
      pvVar7->dims = local_428;
      pvVar7->w = local_424;
      pvVar7->h = (int)in_stack_fffffffffffffbe0;
      pvVar7->d = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
      pvVar7->c = in_stack_fffffffffffffbe8;
      pvVar7->cstep = sVar11;
    }
    if (local_448 != (int *)0x0) {
      LOCK();
      iVar1 = *local_448;
      *local_448 = *local_448 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (local_430 == (Allocator *)0x0) {
          if (local_450 != (void *)0x0) {
            free(local_450);
          }
        }
        else {
          (*local_430->_vptr_Allocator[3])(local_430,local_450);
        }
      }
    }
  }
  bVar5 = true;
  if (local_308->data != (void *)0x0) {
    bVar5 = local_308->cstep * (long)local_308->c == 0;
  }
  if (bVar5) {
    local_2d4 = -100;
  }
  else {
    local_2d4 = 0;
  }
  return local_2d4;
}

Assistant:

int Reshape::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    Mat& top_blob = top_blobs[0];

    // resolve out shape
    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (!shape_expr.empty())
    {
        eval_shape_expr(bottom_blobs, outw, outh, outd, outc);
    }

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}